

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildInt1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  IRType IVar2;
  bool bVar3;
  ValueType valueType;
  RegOpnd *pRVar4;
  RegOpnd *pRVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  undefined6 in_register_00000032;
  OpCode opcode;
  int iVar8;
  
  pRVar4 = BuildSrcOpnd(this,srcRegSlot,TyFloat32);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x108);
  iVar8 = (int)CONCAT62(in_register_00000032,newOpcode);
  pRVar5 = pRVar4;
  if (iVar8 == 0x2e) {
    pRVar4 = BuildDstOpnd(this,dstRegSlot,TyInt32);
    opcode = Reinterpret_Prim;
    goto LAB_004baef0;
  }
  if (iVar8 == 0x117) {
    IVar2 = TyUint32;
LAB_004baedc:
    pRVar4 = BuildDstOpnd(this,dstRegSlot,IVar2);
    opcode = Conv_Prim_Sat;
  }
  else {
    if (iVar8 == 0x35) {
      IVar2 = TyUint32;
    }
    else {
      if ((iVar8 == 0x10d) || (iVar8 == 0x10f)) {
        pRVar5 = IR::RegOpnd::New(TyFloat32,this->m_func);
        IR::Opnd::SetValueType(&pRVar5->super_Opnd,(ValueType)0x108);
        pIVar7 = IR::Instr::New(TrapIfTruncOverflow,&pRVar5->super_Opnd,&pRVar4->super_Opnd,
                                this->m_func);
        AddInstr(this,pIVar7,offset);
        pRVar4 = BuildDstOpnd(this,dstRegSlot,(newOpcode != Conv_Check_FTI) * '\x04' + TyInt32);
        pRVar4->field_0x18 = pRVar4->field_0x18 | 4;
        opcode = Conv_Prim;
        goto LAB_004baef0;
      }
      if (iVar8 == 0x115) {
        IVar2 = TyInt32;
        goto LAB_004baedc;
      }
      if (iVar8 != 0x33) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x862,"((0))","(0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
        opcode = Nop;
        pRVar4 = (RegOpnd *)0x0;
        goto LAB_004baef0;
      }
      IVar2 = TyInt32;
    }
    pRVar4 = BuildDstOpnd(this,dstRegSlot,IVar2);
    opcode = Conv_Prim;
  }
LAB_004baef0:
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,valueType);
  pIVar7 = IR::Instr::New(opcode,&pRVar4->super_Opnd,&pRVar5->super_Opnd,this->m_func);
  AddInstr(this,pIVar7,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat32);
    srcOpnd->SetValueType(ValueType::Float);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Reinterpret_FTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Reinterpret_Prim;
        break;

    case Js::OpCodeAsmJs::Conv_Check_FTI:
    case Js::OpCodeAsmJs::Conv_Check_FTU:
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(TyFloat32, m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd = BuildDstOpnd(dstRegSlot, newOpcode == Js::OpCodeAsmJs::Conv_Check_FTI ? TyInt32 : TyUint32);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
        op = Js::OpCode::Conv_Prim;
        break;
    }
    default:
        Assume(UNREACHED);
    }
    dstOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}